

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall xscript::tokenizer::scanner::print(scanner *this)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  token local_40;
  undefined1 local_28 [8];
  token t;
  scanner *this_local;
  
  t.literal._M_str = (char *)this;
  token::token((token *)local_28);
  do {
    next(&local_40,this);
    local_28 = (undefined1  [8])local_40._0_8_;
    t._0_8_ = local_40.literal._M_len;
    t.literal._M_len = (size_t)local_40.literal._M_str;
    bVar1 = token::operator!=((token *)local_28,TK_SPACE);
    if ((((bVar1) && (bVar1 = token::operator!=((token *)local_28,TK_TAB), bVar1)) &&
        (bVar1 = token::operator!=((token *)local_28,TK_EOL), bVar1)) &&
       (bVar1 = token::operator!=((token *)local_28,TK_EOF), bVar1)) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28._0_4_);
      poVar2 = std::operator<<(poVar2,' ');
      __str._M_str = (char *)t.literal._M_len;
      __str._M_len = t._0_8_;
      this_00 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar2,__str);
      std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = token::operator!=((token *)local_28,TK_EOF);
  } while (bVar1);
  return;
}

Assistant:

void scanner::print() {
    token t;
    do {
        t = next();
        if (t != TK_SPACE && t != TK_TAB && t != TK_EOL && t != TK_EOF) {
            std::cout << t.type << ' ' << t.literal << std::endl;
        }
    } while (t != TK_EOF);
}